

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

void __thiscall
Catch::MessageBuilder::MessageBuilder
          (MessageBuilder *this,StringRef *macroName,SourceLineInfo *lineInfo,OfType type)

{
  size_type sVar1;
  size_t sVar2;
  
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)this);
  sVar1 = macroName->m_size;
  (this->m_info).macroName.m_start = macroName->m_start;
  (this->m_info).macroName.m_size = sVar1;
  (this->m_info).message._M_dataplus._M_p = (pointer)&(this->m_info).message.field_2;
  (this->m_info).message._M_string_length = 0;
  (this->m_info).message.field_2._M_local_buf[0] = '\0';
  sVar2 = lineInfo->line;
  (this->m_info).lineInfo.file = lineInfo->file;
  (this->m_info).lineInfo.line = sVar2;
  (this->m_info).type = type;
  MessageInfo::globalCount = MessageInfo::globalCount + 1;
  (this->m_info).sequence = MessageInfo::globalCount;
  return;
}

Assistant:

Catch::MessageBuilder::MessageBuilder( StringRef const& macroName,
                                           SourceLineInfo const& lineInfo,
                                           ResultWas::OfType type )
        :m_info(macroName, lineInfo, type) {}